

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O2

bool Assimp::IFC::ProcessCurve(IfcCurve *curve,TempMesh *meshout,ConversionData *conv)

{
  Curve *pCVar1;
  BoundedCurve *this;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1d8;
  string local_1b8;
  format local_198;
  
  pCVar1 = Curve::Convert(curve,conv);
  if (pCVar1 == (Curve *)0x0) {
    STEP::Object::GetClassName_abi_cxx11_
              (&local_1b8,
               (Object *)
               ((long)&(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                       _vptr_ObjectHelper +
               (long)(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                     _vptr_ObjectHelper[-3]));
    std::operator+(&bStack_1d8,"skipping unknown IfcCurve entity, type is ",&local_1b8);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_198,
               &bStack_1d8);
    LogFunctions<Assimp::IFCImporter>::LogWarn(&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::__cxx11::string::~string((string *)&bStack_1d8);
    std::__cxx11::string::~string((string *)&local_1b8);
    bVar2 = false;
  }
  else {
    this = (BoundedCurve *)__dynamic_cast(pCVar1,&Curve::typeinfo,&BoundedCurve::typeinfo,0);
    if (this == (BoundedCurve *)0x0) {
      LogFunctions<Assimp::IFCImporter>::LogError((char *)0x4f0975);
    }
    else {
      BoundedCurve::SampleDiscrete(this,meshout);
      local_198._0_4_ =
           SUB84(((long)(meshout->mVerts).
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(meshout->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x18,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&meshout->mVertcnt,(uint *)&local_198);
    }
    bVar2 = this != (BoundedCurve *)0x0;
    (*pCVar1->_vptr_Curve[1])(pCVar1);
  }
  return bVar2;
}

Assistant:

bool ProcessCurve(const Schema_2x3::IfcCurve& curve,  TempMesh& meshout, ConversionData& conv)
{
    std::unique_ptr<const Curve> cv(Curve::Convert(curve,conv));
    if (!cv) {
        IFCImporter::LogWarn("skipping unknown IfcCurve entity, type is " + curve.GetClassName());
        return false;
    }

    // we must have a bounded curve at this point
    if (const BoundedCurve* bc = dynamic_cast<const BoundedCurve*>(cv.get())) {
        try {
            bc->SampleDiscrete(meshout);
        }
        catch(const  CurveError& cv) {
            IFCImporter::LogError(cv.mStr + " (error occurred while processing curve)");
            return false;
        }
        meshout.mVertcnt.push_back(static_cast<unsigned int>(meshout.mVerts.size()));
        return true;
    }

    IFCImporter::LogError("cannot use unbounded curve as profile");
    return false;
}